

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_iso9660_filename.c
# Opt level: O0

wchar_t add_entry(archive_match *a,wchar_t flag,archive_entry *entry)

{
  int iVar1;
  match_file *file;
  char *mbs;
  time_t tVar2;
  long lVar3;
  archive_rb_node *paVar4;
  match_file *f2;
  wchar_t r;
  void *pathname;
  match_file *f;
  archive_entry *entry_local;
  wchar_t flag_local;
  archive_match *a_local;
  
  file = (match_file *)calloc(1,0xb0);
  if (file == (match_file *)0x0) {
    a_local._4_4_ = error_nomem(a);
  }
  else {
    mbs = archive_entry_pathname(entry);
    if (mbs == (char *)0x0) {
      free(file);
      archive_set_error(&a->archive,0x16,"pathname is NULL");
      a_local._4_4_ = L'\xffffffe7';
    }
    else {
      archive_mstring_copy_mbs(&file->pathname,mbs);
      (a->exclusion_tree).rbt_ops = &rb_ops_mbs;
      file->flag = flag;
      tVar2 = archive_entry_mtime(entry);
      file->mtime_sec = tVar2;
      lVar3 = archive_entry_mtime_nsec(entry);
      file->mtime_nsec = lVar3;
      tVar2 = archive_entry_ctime(entry);
      file->ctime_sec = tVar2;
      lVar3 = archive_entry_ctime_nsec(entry);
      file->ctime_nsec = lVar3;
      iVar1 = __archive_rb_tree_insert_node(&a->exclusion_tree,(archive_rb_node *)file);
      if (iVar1 == 0) {
        paVar4 = __archive_rb_tree_find_node(&a->exclusion_tree,mbs);
        if (paVar4 != (archive_rb_node *)0x0) {
          *(wchar_t *)&paVar4[5].rb_info = file->flag;
          paVar4[6].rb_nodes[0] = (archive_rb_node *)file->mtime_sec;
          paVar4[6].rb_nodes[1] = (archive_rb_node *)file->mtime_nsec;
          paVar4[6].rb_info = file->ctime_sec;
          paVar4[7].rb_nodes[0] = (archive_rb_node *)file->ctime_nsec;
        }
        archive_mstring_clean(&file->pathname);
        free(file);
        a_local._4_4_ = L'\0';
      }
      else {
        entry_list_add(&a->exclusion_entry_list,file);
        a->setflag = a->setflag | 2;
        a_local._4_4_ = L'\0';
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static void
add_entry(struct archive *a, const char *fname, const char *sym)
{
	struct archive_entry *ae;

	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_birthtime(ae, 2, 20);
	archive_entry_set_atime(ae, 3, 30);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, fname);
	if (sym != NULL)
		archive_entry_set_symlink(ae, sym);
	archive_entry_set_mode(ae, S_IFREG | 0555);
	archive_entry_set_size(ae, 0);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
}